

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall Parser::Parser(Parser *this)

{
  _Rb_tree_header *p_Var1;
  ConditionInfo local_2a;
  
  (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->macros)._M_t._M_impl.super__Rb_tree_header;
  (this->macros)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->macros)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->macros)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->macros)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->macros)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->macroLabels)._M_t._M_impl.super__Rb_tree_header;
  (this->macroLabels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->macroLabels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->macroLabels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->macroLabels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->macroLabels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->conditionStack).
  super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->conditionStack).
  super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->conditionStack).
  super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->initializingMacro = false;
  this->overrideFileInfo = false;
  local_2a.inTrueBlock = true;
  local_2a.inUnknownBlock = false;
  std::vector<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>::
  emplace_back<Parser::ConditionInfo>(&this->conditionStack,&local_2a);
  this->error = false;
  return;
}

Assistant:

Parser::Parser()
{
	initializingMacro = false;
	overrideFileInfo = false;
	conditionStack.push_back({true,false});
	clearError();
}